

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

void __thiscall merlin::factor::factor(factor *this,variable_set *vs,value s)

{
  size_t __new_size;
  
  this->_vptr_factor = (_func_int **)&PTR__factor_00197548;
  variable_set::variable_set(&this->v_,vs);
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->c_ = -1;
  __new_size = variable_set::num_states(vs);
  std::vector<double,_std::allocator<double>_>::resize(&this->t_,__new_size);
  fill(this,s);
  return;
}

Assistant:

factor(variable_set const& vs, value s = 1.0) : v_(vs), t_(), c_(-1) {
		t_.resize(vs.num_states());
		set_dims();
		fill(s);
	}